

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O2

void __thiscall HighsCliqueTable::runCliqueMerging(HighsCliqueTable *this,HighsDomain *globaldomain)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  int iVar1;
  CliqueVar CVar2;
  int iVar3;
  pointer pCVar4;
  pointer piVar5;
  pointer pCVar6;
  pointer puVar7;
  int *piVar8;
  pointer puVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  HighsInt i_1;
  HighsInt HVar13;
  uint uVar14;
  HighsInt HVar15;
  ulong __new_size;
  ulong uVar16;
  pointer pCVar17;
  long lVar18;
  HighsInt i;
  ulong uVar19;
  iterator __begin7;
  ulong uVar20;
  long lVar21;
  pointer pCVar22;
  const_iterator cVar23;
  CliqueVar CVar24;
  int iVar25;
  CliqueVar *pCVar26;
  iterator __begin3;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  _Var27;
  undefined1 *puVar28;
  const_iterator __first;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  __it;
  HighsInt i_3;
  int *piVar29;
  HighsInt cliqueid;
  undefined4 uStack_104;
  CliqueVar *local_100;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> extensionvars;
  HighsInt originrow;
  ulong local_c8;
  CliqueVar v;
  undefined4 uStack_bc;
  vector<int,_std::allocator<int>_> neighbourhoodInds;
  anon_class_24_3_1a0f6629 addCands;
  
  extensionvars.
  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  extensionvars.
  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  extensionvars.
  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &this->iscandidate;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (this_00,(long)(this->invertedHashList).
                           super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->invertedHashList).
                           super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3);
  neighbourhoodInds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  neighbourhoodInds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  neighbourhoodInds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::reserve
            (&neighbourhoodInds,
             (long)(this->invertedHashList).
                   super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->invertedHashList).
                   super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  __new_size = ((long)(this->cliques).
                      super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->cliques).
                     super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x14;
  if ((ulong)((long)(this->cliquehits).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->cliquehits).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2) < __new_size) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&this->cliquehits,__new_size);
    __new_size = ((long)(this->cliques).
                        super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->cliques).
                       super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x14;
  }
  iVar1 = this->numEntries;
  HVar13 = HighsDomain::numModelNonzeros(globaldomain);
  bVar10 = false;
  for (uVar16 = 0; uVar16 != (__new_size & 0xffffffff); uVar16 = uVar16 + 1) {
    pCVar4 = (this->cliques).
             super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pCVar26 = (CliqueVar *)(uVar16 * 0x14);
    iVar25 = *(int *)(&pCVar26->field_0x0 + (long)pCVar4);
    if ((long)iVar25 != -1) {
      if ((*(int *)(&pCVar26[2].field_0x0 + (long)pCVar4) != 0x7fffffff |
          (&pCVar26[4].field_0x0)[(long)pCVar4]) == 1) {
        if (*(int *)(&pCVar26[2].field_0x0 + (long)pCVar4) == -1) {
          bVar10 = true;
        }
        else {
          local_100 = pCVar26;
          if (*(int *)(&pCVar26[1].field_0x0 + (long)pCVar4) != iVar25) {
            uVar20 = (ulong)(uint)(*(int *)(&pCVar26[1].field_0x0 + (long)pCVar4) - iVar25);
            pCVar26 = (this->cliqueentries).
                      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      ._M_impl.super__Vector_impl_data._M_start + iVar25;
            CVar24 = *pCVar26;
            piVar5 = (this->numcliquesvar).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            iVar25 = piVar5[(int)((int)CVar24 << 1 | (uint)((int)CVar24 < 0))];
            for (uVar19 = 1; uVar20 != uVar19; uVar19 = uVar19 + 1) {
              CVar2 = pCVar26[uVar19];
              iVar3 = piVar5[(int)((int)CVar2 << 1 | (uint)((int)CVar2 < 0))];
              if (iVar3 < iVar25) {
                iVar25 = iVar3;
                CVar24 = CVar2;
              }
            }
            for (uVar19 = 0; uVar20 != uVar19; uVar19 = uVar19 + 1) {
              (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start
              [(int)((int)pCVar26[uVar19] << 1 | (uint)((int)pCVar26[uVar19] < 0))] = '\x01';
            }
            addCands.extensionvars = &extensionvars;
            uVar14 = (int)CVar24 << 1 | (uint)((int)CVar24 < 0);
            _cliqueid = &addCands;
            local_c8 = uVar16;
            addCands.this = this;
            addCands.globaldomain = globaldomain;
            HighsHashTree<int,_int>::
            for_each_recurse<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:2113:9)_&,_0>
                      ((NodePtr)(this->invertedHashList).
                                super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[(int)uVar14].root.
                                ptrAndType,(anon_class_8_1_9cafd1bc_conflict *)&cliqueid);
            _cliqueid = &addCands;
            HighsHashTree<int,_void>::
            for_each_recurse<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:2116:9)_&,_0>
                      ((NodePtr)(this->invertedHashListSizeTwo).
                                super__Vector_base<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[(int)uVar14].root.
                                ptrAndType,(anon_class_8_1_9cafd1bc_conflict *)&cliqueid);
            for (uVar16 = 0;
                pCVar17 = extensionvars.
                          super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                          ._M_impl.super__Vector_impl_data._M_start, uVar20 != uVar16;
                uVar16 = uVar16 + 1) {
              (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start
              [(int)((int)pCVar26[uVar16] << 1 | (uint)((int)pCVar26[uVar16] < 0))] = '\0';
            }
            for (; pCVar17 !=
                   extensionvars.
                   super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                   ._M_impl.super__Vector_impl_data._M_finish; pCVar17 = pCVar17 + 1) {
              (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start
              [(int)((int)*pCVar17 << 1 | (uint)((int)*pCVar17 < 0))] = '\0';
            }
            uVar16 = 0;
            while ((uVar20 != uVar16 &&
                   (extensionvars.
                    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    ._M_impl.super__Vector_impl_data._M_start !=
                    extensionvars.
                    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    ._M_impl.super__Vector_impl_data._M_finish))) {
              if (pCVar26[uVar16] != CVar24) {
                HVar15 = shrinkToNeighbourhood
                                   (this,&neighbourhoodInds,&this->numNeighbourhoodQueries,
                                    pCVar26[uVar16],
                                    extensionvars.
                                    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (HighsInt)
                                    ((ulong)((long)extensionvars.
                                                                                                      
                                                  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)extensionvars.
                                                  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 2));
                std::
                vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
                erase(&extensionvars,
                      extensionvars.
                      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      ._M_impl.super__Vector_impl_data._M_start + HVar15,
                      (const_iterator)
                      extensionvars.
                      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
              }
              uVar16 = uVar16 + 1;
            }
            if (extensionvars.
                super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                extensionvars.
                super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              HighsRandom::shuffle<HighsCliqueTable::CliqueVar>
                        (&this->randgen,
                         extensionvars.
                         super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (HighsInt)
                         ((ulong)((long)extensionvars.
                                        super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)extensionvars.
                                       super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 2));
              lVar21 = 4;
              iVar25 = -1;
              for (uVar16 = 0;
                  uVar19 = (long)extensionvars.
                                 super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)extensionvars.
                                 super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 2, uVar16 < uVar19;
                  uVar16 = uVar16 + 1) {
                HVar15 = shrinkToNeighbourhood
                                   (this,&neighbourhoodInds,&this->numNeighbourhoodQueries,
                                    extensionvars.
                                    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar16],
                                    (CliqueVar *)
                                    (&(extensionvars.
                                       super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->field_0x0 +
                                    lVar21),(int)uVar19 + iVar25);
                iVar25 = iVar25 + -1;
                lVar21 = lVar21 + 4;
                std::
                vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
                erase(&extensionvars,
                      extensionvars.
                      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      ._M_impl.super__Vector_impl_data._M_start + (HVar15 + (int)uVar16 + 1),
                      (const_iterator)
                      extensionvars.
                      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
              }
            }
            pCVar22 = extensionvars.
                      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            pCVar17 = extensionvars.
                      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pCVar4 = (this->cliques).
                     super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if ((&local_100[4].field_0x0)[(long)pCVar4] == '\x01') {
              for (; pCVar17 != pCVar22; pCVar17 = pCVar17 + 1) {
                vertexInfeasible(this,globaldomain,(uint)*pCVar17 & 0x7fffffff,
                                 (uint)*pCVar17 >> 0x1f);
              }
            }
            else {
              piVar29 = (int *)(&local_100->field_0x0 + (long)pCVar4);
              originrow = piVar29[2];
              piVar29[2] = 0x7fffffff;
              pCVar6 = (this->cliqueentries).
                       super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
              insert<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,void>
                        ((vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                          *)&extensionvars,
                         (const_iterator)
                         extensionvars.
                         super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                         ._M_impl.super__Vector_impl_data._M_finish,pCVar6 + *piVar29,
                         pCVar6 + piVar29[1]);
              uVar16 = (long)pCVar22 - (long)pCVar17;
              puVar28 = &(extensionvars.
                          super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                          ._M_impl.super__Vector_impl_data._M_start)->field_0x0 +
                        ((long)(uVar16 * 0x40000000) >> 0x1e);
              uVar16 = uVar16 >> 2;
              puVar7 = (this->colDeleted).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
              lVar18 = 0;
              for (lVar21 = (long)extensionvars.
                                  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)puVar28 >> 4;
                  HVar15 = (HighsInt)local_c8, 0 < lVar21; lVar21 = lVar21 + -1) {
                if (puVar7[*(uint *)(puVar28 + lVar18) & 0x7fffffff] != '\0') {
                  pCVar26 = (CliqueVar *)(puVar28 + lVar18);
                  goto LAB_0027a7ec;
                }
                if (puVar7[*(uint *)(puVar28 + lVar18 + 4) & 0x7fffffff] != '\0') {
                  pCVar26 = (CliqueVar *)(puVar28 + lVar18 + 4);
                  goto LAB_0027a7ec;
                }
                if (puVar7[*(uint *)(puVar28 + lVar18 + 8) & 0x7fffffff] != '\0') {
                  pCVar26 = (CliqueVar *)(puVar28 + lVar18 + 8);
                  goto LAB_0027a7ec;
                }
                if (puVar7[*(uint *)(puVar28 + lVar18 + 0xc) & 0x7fffffff] != '\0') {
                  pCVar26 = (CliqueVar *)(puVar28 + lVar18 + 0xc);
                  goto LAB_0027a7ec;
                }
                lVar18 = lVar18 + 0x10;
              }
              lVar21 = ((long)extensionvars.
                              super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)puVar28) - lVar18
                       >> 2;
              pCVar26 = (CliqueVar *)(puVar28 + lVar18);
              if (lVar21 == 3) {
                if (puVar7[(uint)*pCVar26 & 0x7fffffff] == '\0') {
                  pCVar26 = (CliqueVar *)(puVar28 + lVar18 + 4);
                  goto LAB_0027a7ca;
                }
LAB_0027a7ec:
                cVar23._M_current = pCVar26;
                if (pCVar26 !=
                    extensionvars.
                    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  do {
                    do {
                      pCVar26 = pCVar26 + 1;
                      if (pCVar26 ==
                          extensionvars.
                          super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                          ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0027a841;
                    } while ((this->colDeleted).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start[(uint)*pCVar26 & 0x7fffffff]
                             != '\0');
                    *cVar23._M_current = *pCVar26;
                    cVar23._M_current = cVar23._M_current + 1;
                  } while( true );
                }
              }
              else {
                if (lVar21 == 2) {
LAB_0027a7ca:
                  if (puVar7[(uint)*pCVar26 & 0x7fffffff] == '\0') {
                    pCVar26 = pCVar26 + 1;
                    goto LAB_0027a7dc;
                  }
                  goto LAB_0027a7ec;
                }
                cVar23._M_current =
                     extensionvars.
                     super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                if (lVar21 == 1) {
LAB_0027a7dc:
                  if (puVar7[(uint)*pCVar26 & 0x7fffffff] == '\0') {
                    pCVar26 = extensionvars.
                              super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                  }
                  goto LAB_0027a7ec;
                }
              }
LAB_0027a841:
              std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
              ::erase(&extensionvars,cVar23,
                      (const_iterator)
                      extensionvars.
                      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
              removeClique(this,HVar15);
              pCVar17 = extensionvars.
                        super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              for (pCVar22 = extensionvars.
                             super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                             ._M_impl.super__Vector_impl_data._M_start; pCVar22 != pCVar17;
                  pCVar22 = pCVar22 + 1) {
                uVar14 = (int)*pCVar22 << 1 | (uint)((int)*pCVar22 < 0);
                _cliqueid = (anon_class_24_3_1a0f6629 *)this;
                HighsHashTree<int,_int>::
                for_each_recurse<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:2167:46)_&,_0>
                          ((NodePtr)(this->invertedHashList).
                                    super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[(int)uVar14].root.
                                    ptrAndType,(anon_class_8_1_8991fb9c *)&cliqueid);
                _cliqueid = (anon_class_24_3_1a0f6629 *)this;
                HighsHashTree<int,_void>::
                for_each_recurse<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:2173:53)_&,_0>
                          ((NodePtr)(this->invertedHashListSizeTwo).
                                    super__Vector_base<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[(int)uVar14].root.
                                    ptrAndType,(anon_class_8_1_8991fb9c *)&cliqueid);
              }
              piVar29 = (this->cliquehitinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              piVar8 = (this->cliquehitinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              local_100 = (CliqueVar *)CONCAT44(local_100._4_4_,0x7fffffff);
              bVar12 = false;
              for (; pCVar17 = extensionvars.
                               super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                               ._M_impl.super__Vector_impl_data._M_finish, piVar29 != piVar8;
                  piVar29 = piVar29 + 1) {
                iVar25 = *piVar29;
                cliqueid = iVar25;
                puVar9 = (this->cliquehits).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                uVar14 = puVar9[iVar25];
                puVar9[iVar25] = 0;
                pCVar4 = (this->cliques).
                         super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if (uVar14 == (uint)((ulong)((long)extensionvars.
                                                                                                      
                                                  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)extensionvars.
                                                  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 2))
                {
                  bVar12 = true;
                  if ((pCVar4[iVar25].origin | 0x80000000U) != 0xffffffff) {
                    local_100 = (CliqueVar *)CONCAT44(local_100._4_4_,pCVar4[iVar25].origin);
                  }
                }
                else if (pCVar4[iVar25].end - (pCVar4[iVar25].start + pCVar4[iVar25].numZeroFixed)
                         == uVar14) {
                  pCVar22 = extensionvars.
                            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  if (pCVar4[iVar25].equality == true) {
                    for (; pCVar22 != pCVar17; pCVar22 = pCVar22 + 1) {
                      CVar24 = *pCVar22;
                      _v = (HighsDomain *)CONCAT44(uStack_bc,CVar24);
                      pCVar4 = (this->cliques).
                               super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                      uVar14 = (int)CVar24 << 1 | (uint)((int)CVar24 < 0);
                      if (pCVar4[cliqueid].end - pCVar4[cliqueid].start == 2) {
                        bVar11 = HighsHashTree<int,_void>::contains
                                           ((this->invertedHashListSizeTwo).
                                            super__Vector_base<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start + (int)uVar14,
                                            &cliqueid);
                      }
                      else {
                        bVar11 = HighsHashTree<int,_int>::contains
                                           ((this->invertedHashList).
                                            super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start + (int)uVar14,
                                            &cliqueid);
                      }
                      if (bVar11 == false) {
                        std::
                        vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                        ::push_back(&this->infeasvertexstack,&v);
                      }
                    }
                  }
                  else {
                    removeClique(this,iVar25);
                  }
                }
              }
              piVar5 = (this->cliquehitinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              if ((this->cliquehitinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish != piVar5) {
                (this->cliquehitinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = piVar5;
              }
              if (bVar12) {
                if ((int)local_100 == 0x7fffffff) {
                  uVar19 = uVar16 & 0xffffffff;
                  if ((int)uVar16 < 1) {
                    uVar19 = 0;
                  }
                  for (lVar21 = 0; uVar19 * 4 != lVar21; lVar21 = lVar21 + 4) {
                    std::
                    vector<std::pair<int,HighsCliqueTable::CliqueVar>,std::allocator<std::pair<int,HighsCliqueTable::CliqueVar>>>
                    ::emplace_back<int&,HighsCliqueTable::CliqueVar&>
                              ((vector<std::pair<int,HighsCliqueTable::CliqueVar>,std::allocator<std::pair<int,HighsCliqueTable::CliqueVar>>>
                                *)&this->cliqueextensions,&originrow,
                               (CliqueVar *)
                               (&(extensionvars.
                                  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->field_0x0 + lVar21));
                  }
                }
                else {
                  std::vector<int,_std::allocator<int>_>::push_back(&this->deletedrows,&originrow);
                }
              }
              else {
                uVar19 = uVar16 & 0xffffffff;
                if ((int)uVar16 < 1) {
                  uVar19 = 0;
                }
                for (lVar21 = 0; uVar19 * 4 != lVar21; lVar21 = lVar21 + 4) {
                  std::
                  vector<std::pair<int,HighsCliqueTable::CliqueVar>,std::allocator<std::pair<int,HighsCliqueTable::CliqueVar>>>
                  ::emplace_back<int&,HighsCliqueTable::CliqueVar&>
                            ((vector<std::pair<int,HighsCliqueTable::CliqueVar>,std::allocator<std::pair<int,HighsCliqueTable::CliqueVar>>>
                              *)&this->cliqueextensions,&originrow,
                             (CliqueVar *)
                             (&(extensionvars.
                                super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                ._M_impl.super__Vector_impl_data._M_start)->field_0x0 + lVar21));
                }
                local_100 = extensionvars.
                            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                lVar21 = (long)extensionvars.
                               super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)extensionvars.
                               super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                __it._M_current =
                     extensionvars.
                     super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                     ._M_impl.super__Vector_impl_data._M_start;
                _cliqueid = (anon_class_24_3_1a0f6629 *)globaldomain;
                _v = globaldomain;
                for (lVar18 = lVar21 >> 4; _Var27._M_current = __it._M_current, 0 < lVar18;
                    lVar18 = lVar18 + -1) {
                  bVar12 = __gnu_cxx::__ops::
                           _Iter_pred<HighsCliqueTable::runCliqueMerging(HighsDomain&)::$_6>::
                           operator()((_Iter_pred<HighsCliqueTable::runCliqueMerging(HighsDomain&)::__6>
                                       *)&cliqueid,__it);
                  pCVar26 = local_100;
                  if (bVar12) goto LAB_0027ab62;
                  bVar12 = __gnu_cxx::__ops::
                           _Iter_pred<HighsCliqueTable::runCliqueMerging(HighsDomain&)::$_6>::
                           operator()((_Iter_pred<HighsCliqueTable::runCliqueMerging(HighsDomain&)::__6>
                                       *)&cliqueid,__it._M_current + 1);
                  pCVar26 = local_100;
                  _Var27._M_current = __it._M_current + 1;
                  if (bVar12) goto LAB_0027ab62;
                  bVar12 = __gnu_cxx::__ops::
                           _Iter_pred<HighsCliqueTable::runCliqueMerging(HighsDomain&)::$_6>::
                           operator()((_Iter_pred<HighsCliqueTable::runCliqueMerging(HighsDomain&)::__6>
                                       *)&cliqueid,__it._M_current + 2);
                  pCVar26 = local_100;
                  _Var27._M_current = __it._M_current + 2;
                  if (bVar12) goto LAB_0027ab62;
                  bVar12 = __gnu_cxx::__ops::
                           _Iter_pred<HighsCliqueTable::runCliqueMerging(HighsDomain&)::$_6>::
                           operator()((_Iter_pred<HighsCliqueTable::runCliqueMerging(HighsDomain&)::__6>
                                       *)&cliqueid,__it._M_current + 3);
                  pCVar26 = local_100;
                  _Var27._M_current = __it._M_current + 3;
                  if (bVar12) goto LAB_0027ab62;
                  __it._M_current = __it._M_current + 4;
                  lVar21 = lVar21 + -0x10;
                }
                lVar21 = lVar21 >> 2;
                pCVar26 = local_100;
                if (lVar21 == 1) {
LAB_0027ac36:
                  bVar12 = __gnu_cxx::__ops::
                           _Iter_pred<HighsCliqueTable::runCliqueMerging(HighsDomain&)::$_6>::
                           operator()((_Iter_pred<HighsCliqueTable::runCliqueMerging(HighsDomain&)::__6>
                                       *)&cliqueid,__it);
                  _Var27._M_current = __it._M_current;
                  if (!bVar12) {
                    _Var27._M_current = pCVar26;
                  }
LAB_0027ab62:
                  cVar23._M_current = pCVar26;
                  __first._M_current = _Var27._M_current;
                  if (_Var27._M_current != pCVar26) {
                    while (_Var27._M_current = _Var27._M_current + 1,
                          cVar23._M_current =
                               extensionvars.
                               super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                               ._M_impl.super__Vector_impl_data._M_finish,
                          _Var27._M_current != pCVar26) {
                      bVar12 = __gnu_cxx::__ops::
                               _Iter_pred<HighsCliqueTable::runCliqueMerging(HighsDomain&)::$_6>::
                               operator()((_Iter_pred<HighsCliqueTable::runCliqueMerging(HighsDomain&)::__6>
                                           *)&v,_Var27);
                      if (!bVar12) {
                        *__first._M_current = *_Var27._M_current;
                        __first._M_current = __first._M_current + 1;
                      }
                    }
                  }
                }
                else {
                  if (lVar21 == 2) {
LAB_0027ac1c:
                    pCVar26 = local_100;
                    bVar12 = __gnu_cxx::__ops::
                             _Iter_pred<HighsCliqueTable::runCliqueMerging(HighsDomain&)::$_6>::
                             operator()((_Iter_pred<HighsCliqueTable::runCliqueMerging(HighsDomain&)::__6>
                                         *)&cliqueid,__it);
                    _Var27._M_current = __it._M_current;
                    if (!bVar12) {
                      __it._M_current = __it._M_current + 1;
                      goto LAB_0027ac36;
                    }
                    goto LAB_0027ab62;
                  }
                  cVar23._M_current = local_100;
                  __first._M_current = local_100;
                  if (lVar21 == 3) {
                    bVar12 = __gnu_cxx::__ops::
                             _Iter_pred<HighsCliqueTable::runCliqueMerging(HighsDomain&)::$_6>::
                             operator()((_Iter_pred<HighsCliqueTable::runCliqueMerging(HighsDomain&)::__6>
                                         *)&cliqueid,__it);
                    pCVar26 = local_100;
                    if (!bVar12) {
                      __it._M_current = __it._M_current + 1;
                      goto LAB_0027ac1c;
                    }
                    goto LAB_0027ab62;
                  }
                }
                std::
                vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
                erase(&extensionvars,__first,cVar23);
                uVar16 = (long)extensionvars.
                               super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)extensionvars.
                               super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 2;
                if (1 < uVar16) {
                  doAddClique(this,extensionvars.
                                   super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                   ._M_impl.super__Vector_impl_data._M_start,(HighsInt)uVar16,false,
                              originrow);
                }
              }
            }
            if (extensionvars.
                super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                extensionvars.
                super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              extensionvars.
              super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   extensionvars.
                   super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                   ._M_impl.super__Vector_impl_data._M_start;
            }
            processInfeasibleVertices(this,globaldomain);
            uVar16 = local_c8;
            if (HVar13 + iVar1 <= this->numEntries) break;
          }
        }
      }
    }
  }
  if (bVar10) {
    lVar21 = 8;
    for (uVar16 = 0; (__new_size & 0xffffffff) != uVar16; uVar16 = uVar16 + 1) {
      pCVar4 = (this->cliques).
               super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar18 = (long)*(int *)((long)pCVar4 + lVar21 + -8);
      if ((lVar18 != -1) && (*(int *)((long)&pCVar4->start + lVar21) == -1)) {
        if (extensionvars.
            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            extensionvars.
            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          extensionvars.
          super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               extensionvars.
               super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
               ._M_impl.super__Vector_impl_data._M_start;
        }
        pCVar17 = (this->cliqueentries).
                  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
        insert<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,void>
                  ((vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                    *)&extensionvars,
                   (const_iterator)
                   extensionvars.
                   super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                   ._M_impl.super__Vector_impl_data._M_finish,pCVar17 + lVar18,
                   pCVar17 + *(int *)((long)pCVar4 + lVar21 + -4));
        removeClique(this,(HighsInt)uVar16);
        runCliqueMerging(this,globaldomain,&extensionvars,false);
        uVar19 = (long)extensionvars.
                       super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)extensionvars.
                       super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 2;
        if (1 < uVar19) {
          doAddClique(this,extensionvars.
                           super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                           ._M_impl.super__Vector_impl_data._M_start,(HighsInt)uVar19,false,
                      0x7fffffff);
        }
      }
      lVar21 = lVar21 + 0x14;
    }
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&neighbourhoodInds.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
  ~_Vector_base(&extensionvars.
                 super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
               );
  return;
}

Assistant:

void HighsCliqueTable::runCliqueMerging(HighsDomain& globaldomain) {
  std::vector<CliqueVar> extensionvars;
  iscandidate.resize(invertedHashList.size());
  std::vector<HighsInt> neighbourhoodInds;
  neighbourhoodInds.reserve(invertedHashList.size());

  if (cliquehits.size() < cliques.size()) cliquehits.resize(cliques.size());

  HighsInt numcliqueslots = cliques.size();
  const HighsInt maxNewEntries = numEntries + globaldomain.numModelNonzeros();
  bool haveNonModelCliquesToMerge = false;
  for (HighsInt k = 0; k != numcliqueslots; ++k) {
    if (cliques[k].start == -1) continue;
    if (!cliques[k].equality && cliques[k].origin == kHighsIInf) continue;
    if (cliques[k].origin == -1) {
      haveNonModelCliquesToMerge = true;
      continue;
    }
    HighsInt numclqvars = cliques[k].end - cliques[k].start;
    assert(numclqvars != 0);
    if (numclqvars == 0) continue;

    CliqueVar* clqvars = &cliqueentries[cliques[k].start];

    CliqueVar extensionstart = clqvars[0];
    HighsInt numcliques = numCliques(clqvars[0]);
    for (HighsInt i = 1; i != numclqvars; ++i) {
      HighsInt thisNumClqs = numCliques(clqvars[i]);
      if (thisNumClqs < numcliques) {
        numcliques = thisNumClqs;
        extensionstart = clqvars[i];
      }
    }

    for (HighsInt i = 0; i != numclqvars; ++i)
      iscandidate[clqvars[i].index()] = true;

    auto addCands = [&](HighsInt cliqueid) {
      HighsInt start = cliques[cliqueid].start;
      HighsInt end = cliques[cliqueid].end;

      for (HighsInt i = start; i != end; ++i) {
        if (iscandidate[cliqueentries[i].index()] ||
            globaldomain.isFixed(cliqueentries[i].col))
          continue;

        iscandidate[cliqueentries[i].index()] = true;
        extensionvars.push_back(cliqueentries[i]);
      }
    };

    invertedHashList[extensionstart.index()].for_each(
        [&](HighsInt cliqueid) { addCands(cliqueid); });

    invertedHashListSizeTwo[extensionstart.index()].for_each(
        [&](HighsInt cliqueid) { addCands(cliqueid); });

    for (HighsInt i = 0; i != numclqvars; ++i)
      iscandidate[clqvars[i].index()] = false;
    for (CliqueVar v : extensionvars) iscandidate[v.index()] = false;

    for (HighsInt i = 0; i != numclqvars && !extensionvars.empty(); ++i) {
      if (clqvars[i] == extensionstart) continue;

      HighsInt newSize = shrinkToNeighbourhood(
          neighbourhoodInds, numNeighbourhoodQueries, clqvars[i],
          extensionvars.data(), extensionvars.size());
      extensionvars.erase(extensionvars.begin() + newSize, extensionvars.end());
    }

    if (!extensionvars.empty()) {
      // todo, shuffle extension vars?
      randgen.shuffle(extensionvars.data(), extensionvars.size());
      size_t i = 0;
      while (i < extensionvars.size()) {
        CliqueVar extvar = extensionvars[i];
        i += 1;

        HighsInt newSize =
            i + shrinkToNeighbourhood(
                    neighbourhoodInds, numNeighbourhoodQueries, extvar,
                    extensionvars.data() + i, extensionvars.size() - i);
        extensionvars.erase(extensionvars.begin() + newSize,
                            extensionvars.end());
      }
    }

    if (cliques[k].equality) {
      for (CliqueVar v : extensionvars)
        vertexInfeasible(globaldomain, v.col, v.val);
    } else {
      HighsInt originrow = cliques[k].origin;
      cliques[k].origin = kHighsIInf;

      HighsInt numExtensions = extensionvars.size();
      extensionvars.insert(extensionvars.end(),
                           cliqueentries.begin() + cliques[k].start,
                           cliqueentries.begin() + cliques[k].end);
      extensionvars.erase(
          std::remove_if(
              extensionvars.begin() + numExtensions, extensionvars.end(),
              [&](CliqueVar clqvar) { return colDeleted[clqvar.col]; }),
          extensionvars.end());
      removeClique(k);

      for (CliqueVar v : extensionvars) {
        invertedHashList[v.index()].for_each([&](HighsInt cliqueid) {
          if (cliquehits[cliqueid] == 0) cliquehitinds.push_back(cliqueid);

          ++cliquehits[cliqueid];
        });

        invertedHashListSizeTwo[v.index()].for_each([&](HighsInt cliqueid) {
          if (cliquehits[cliqueid] == 0) cliquehitinds.push_back(cliqueid);

          ++cliquehits[cliqueid];
        });
      }

      bool redundant = false;
      HighsInt dominatingOrigin = kHighsIInf;
      for (HighsInt cliqueid : cliquehitinds) {
        HighsInt hits = cliquehits[cliqueid];
        cliquehits[cliqueid] = 0;

        if (hits == (HighsInt)extensionvars.size()) {
          redundant = true;
          if (cliques[cliqueid].origin != kHighsIInf &&
              cliques[cliqueid].origin != -1)
            dominatingOrigin = cliques[cliqueid].origin;
        } else if (cliques[cliqueid].end - cliques[cliqueid].start -
                       cliques[cliqueid].numZeroFixed ==
                   hits) {
          if (cliques[cliqueid].equality) {
            for (CliqueVar v : extensionvars) {
              bool sizeTwo =
                  cliques[cliqueid].end - cliques[cliqueid].start == 2;
              bool vHasClq =
                  sizeTwo
                      ? invertedHashListSizeTwo[v.index()].contains(cliqueid)
                      : invertedHashList[v.index()].contains(cliqueid);
              if (!vHasClq) infeasvertexstack.push_back(v);
            }
          } else {
            removeClique(cliqueid);
          }
        }
      }

      cliquehitinds.clear();

      if (!redundant) {
        for (HighsInt i = 0; i < numExtensions; ++i)
          cliqueextensions.emplace_back(originrow, extensionvars[i]);

        extensionvars.erase(
            std::remove_if(extensionvars.begin(), extensionvars.end(),
                           [&](CliqueVar v) {
                             return globaldomain.isFixed(v.col) &&
                                    static_cast<int>(
                                        globaldomain.col_lower_[v.col]) ==
                                        static_cast<int>(1 - v.val);
                           }),
            extensionvars.end());

        if (extensionvars.size() > 1)
          doAddClique(extensionvars.data(), extensionvars.size(), false,
                      originrow);
      } else {
        // the extended clique is redundant, check if the row can be removed
        if (dominatingOrigin != kHighsIInf)
          deletedrows.push_back(originrow);
        else {
          // this clique is redundant in the cliquetable but its row is not
          // necessarily. Also there might be rows that have been deleted due to
          // being dominated by this row after adding the lifted entries so they
          // must be added to the cliqueextension vector
          for (HighsInt i = 0; i < numExtensions; ++i)
            cliqueextensions.emplace_back(originrow, extensionvars[i]);
        }
      }
    }

    extensionvars.clear();
    processInfeasibleVertices(globaldomain);

    if (numEntries >= maxNewEntries) break;
    // printf("nonzeroDelta: %d, maxNonzeroDelta: %d\n", nonzeroDelta,
    // maxNonzeroDelta);
  }

  if (haveNonModelCliquesToMerge) {
    for (HighsInt k = 0; k != numcliqueslots; ++k) {
      if (cliques[k].start == -1) continue;
      if (cliques[k].origin != -1) continue;
      // if (cliques[k].end - cliques[k].start <= 1000) continue;

      // printf("numEntries before: %d\n", numEntries);
      extensionvars.clear();
      extensionvars.insert(extensionvars.end(),
                           cliqueentries.begin() + cliques[k].start,
                           cliqueentries.begin() + cliques[k].end);
      removeClique(k);
      runCliqueMerging(globaldomain, extensionvars);

      if (extensionvars.size() > 1)
        doAddClique(extensionvars.data(), extensionvars.size());
    }
  }
}